

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O3

void __thiscall read_node_v10::operator()(read_node_v10 *this,ai_node *node,xr_reader *r)

{
  uint8_t *puVar1;
  uint16_t *puVar2;
  long lVar3;
  uint8_t *puVar4;
  uint32_t u24;
  uint32_t local_1c;
  
  puVar4 = (r->field_2).m_p;
  lVar3 = 0;
  do {
    node->data[lVar3] = *puVar4;
    puVar1 = (r->field_2).m_p;
    puVar4 = puVar1 + 1;
    (r->field_2).m_p = puVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xc);
  (r->field_2).m_p = puVar1 + 3;
  node->cover = *(uint16_t *)(puVar1 + 1);
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  node->low_cover = *puVar2;
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  node->plane = *puVar2;
  local_1c = 0;
  xray_re::xr_reader::r_raw(r,&local_1c,3);
  node->packed_xz = local_1c;
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  node->packed_y = *puVar2;
  return;
}

Assistant:

void operator()(ai_node& node, xr_reader& r) const {
	r.r_cseq(12, node.data);
	node.cover = r.r_u16();
	node.low_cover = r.r_u16();
	node.plane = r.r_u16();
	node.packed_xz = r.r_u24();
	node.packed_y = r.r_u16();
}